

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O0

void __thiscall QHttpThreadDelegate::~QHttpThreadDelegate(QHttpThreadDelegate *this)

{
  bool bVar1;
  QNetworkAccessCache *in_RDI;
  QNetworkAccessCache *this_00;
  
  *(undefined ***)in_RDI = &PTR_metaObject_0049e628;
  this_00 = in_RDI;
  if ((*(long *)(in_RDI + 7) != 0) && (*(long **)(in_RDI + 7) != (long *)0x0)) {
    (**(code **)(**(long **)(in_RDI + 7) + 0x20))();
  }
  bVar1 = QThreadStorage<QNetworkAccessCache_*>::hasLocalData
                    ((QThreadStorage<QNetworkAccessCache_*> *)0x30d0ad);
  if ((bVar1) && (bVar1 = QByteArray::isEmpty((QByteArray *)0x30d0c4), !bVar1)) {
    QThreadStorage<QNetworkAccessCache_*>::localData
              ((QThreadStorage<QNetworkAccessCache_*> *)0x30d0d4);
    QNetworkAccessCache::releaseEntry(this_00,(QByteArray *)in_RDI);
  }
  QByteArray::~QByteArray((QByteArray *)0x30d0f9);
  QSharedPointer<char>::~QSharedPointer((QSharedPointer<char> *)0x30d10a);
  QHttp2Configuration::~QHttp2Configuration((QHttp2Configuration *)0x30d11b);
  QHttp1Configuration::~QHttp1Configuration((QHttp1Configuration *)&in_RDI[5].lastExpiringNode);
  QString::~QString((QString *)0x30d13d);
  QString::~QString((QString *)0x30d14e);
  QHttpHeaders::~QHttpHeaders((QHttpHeaders *)0x30d15f);
  QByteArray::~QByteArray((QByteArray *)0x30d170);
  std::shared_ptr<QNetworkAccessAuthenticationManager>::~shared_ptr
            ((shared_ptr<QNetworkAccessAuthenticationManager> *)0x30d17e);
  QNetworkProxy::~QNetworkProxy((QNetworkProxy *)0x30d18c);
  QNetworkProxy::~QNetworkProxy((QNetworkProxy *)0x30d19a);
  std::shared_ptr<QAtomicInt>::~shared_ptr((shared_ptr<QAtomicInt> *)0x30d1a8);
  std::shared_ptr<QAtomicInt>::~shared_ptr((shared_ptr<QAtomicInt> *)0x30d1b6);
  QHttpNetworkRequest::~QHttpNetworkRequest((QHttpNetworkRequest *)in_RDI);
  QScopedPointer<QSslConfiguration,_QScopedPointerDeleter<QSslConfiguration>_>::~QScopedPointer
            ((QScopedPointer<QSslConfiguration,_QScopedPointerDeleter<QSslConfiguration>_> *)in_RDI)
  ;
  QObject::~QObject(&in_RDI->super_QObject);
  return;
}

Assistant:

QHttpThreadDelegate::~QHttpThreadDelegate()
{
    // It could be that the main thread has asked us to shut down, so we need to delete the HTTP reply
    if (httpReply) {
        delete httpReply;
    }

    // Get the object cache that stores our QHttpNetworkConnection objects
    // and release the entry for this QHttpNetworkConnection
    if (connections.hasLocalData() && !cacheKey.isEmpty()) {
        connections.localData()->releaseEntry(cacheKey);
    }
}